

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O1

void __thiscall OpenMD::StuntDouble::setA(StuntDouble *this,RotMat3x3d *a,int snapshotNo)

{
  uint i;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  double (*padVar3) [3];
  long lVar4;
  
  iVar1 = (*this->snapshotMan_->_vptr_SnapshotManager[4])
                    (this->snapshotMan_,(ulong)(uint)snapshotNo);
  padVar3 = (double (*) [3])
            ((long)this->localIndex_ * 0x48 +
            *(long *)(CONCAT44(extraout_var,iVar1) + 0x48 + this->storage_));
  if ((RotMat3x3d *)padVar3 != a) {
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar3)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar4] =
             (((SquareMatrix<double,_3> *)*(double (*) [3])a)->super_RectMatrix<double,_3U,_3U>).
             data_[0][lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar2 = lVar2 + 1;
      padVar3 = padVar3 + 1;
      a = (RotMat3x3d *)((long)a + 0x18);
    } while (lVar2 != 3);
  }
  return;
}

Assistant:

virtual void setA(const RotMat3x3d& a, int snapshotNo) {
      ((snapshotMan_->getSnapshot(snapshotNo))->*storage_).aMat[localIndex_] =
          a;
    }